

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O3

void anon_unknown.dwarf_87ea::test_art_iterator_lower_bound(void **param_1)

{
  _Bool _Var1;
  ulong uVar2;
  initializer_list<const_char_*> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<const_char_*> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<const_char_*> __l_03;
  initializer_list<unsigned_long> __l_04;
  vector<const_char_*,_std::allocator<const_char_*>_> keys;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  art_iterator_t iterator;
  art_t art;
  vector<const_char_*,_std::allocator<const_char_*>_> local_178;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_160;
  art_iterator_t local_148;
  art_t local_b8;
  
  art_init_cleared(&local_b8);
  art_init_iterator(&local_148,&local_b8,true);
  _assert_true((ulong)(local_148.value == (art_val_t *)0x0),"iterator.value",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x14a);
  _Var1 = art_iterator_lower_bound(&local_148,(art_key_chunk_t *)"000000");
  _assert_true((ulong)!_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)\"000000\")",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x14c);
  _Var1 = art_iterator_lower_bound(&local_148,(art_key_chunk_t *)"000001");
  _assert_true((ulong)!_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)\"000001\")",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x14e);
  art_free(&local_b8);
  local_b8.first_free[3] = 0x10e13f;
  local_b8.first_free[1] = 0x10e131;
  local_b8.first_free[2] = 0x10e138;
  local_b8.root = 0x10e123;
  local_b8.first_free[0] = 0x10e12a;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_b8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_178,__l,(allocator_type *)&local_148);
  local_b8.first_free[1] = 3;
  local_b8.first_free[2] = 4;
  local_b8.root = 1;
  local_b8.first_free[0] = 2;
  local_b8.first_free[3] = 5;
  __l_00._M_len = 5;
  __l_00._M_array = &local_b8.root;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_160,__l_00,(allocator_type *)&local_148);
  art_init_cleared(&local_b8);
  if (local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar2 = 0;
    do {
      art_insert(&local_b8,
                 (art_key_chunk_t *)
                 local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar2],
                 local_160.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar2]);
      assert_art_valid((art_t *)&local_b8);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)((long)local_178.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_178.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  art_init_iterator(&local_148,&local_b8,true);
  _Var1 = art_iterator_lower_bound
                    (&local_148,
                     (art_key_chunk_t *)
                     local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[2]);
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)keys[2])",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x15f);
  assert_key_eq(local_148.key,
                (art_key_chunk_t *)
                local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start[2]);
  _Var1 = art_iterator_lower_bound(&local_148,(art_key_chunk_t *)"000005");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x162);
  assert_key_eq(local_148.key,
                (art_key_chunk_t *)
                local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start[4]);
  art_free(&local_b8);
  if (local_160.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  local_b8.first_free[1] = 0x10e138;
  local_b8.first_free[2] = 0x10e13f;
  local_b8.root = 0x10e123;
  local_b8.first_free[0] = 0x10e131;
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)&local_b8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_178,__l_01,(allocator_type *)&local_148);
  local_b8.first_free[1] = 4;
  local_b8.first_free[2] = 5;
  local_b8.root = 1;
  local_b8.first_free[0] = 3;
  __l_02._M_len = 4;
  __l_02._M_array = &local_b8.root;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_160,__l_02,(allocator_type *)&local_148);
  art_init_cleared(&local_b8);
  if (local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar2 = 0;
    do {
      art_insert(&local_b8,
                 (art_key_chunk_t *)
                 local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar2],
                 local_160.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar2]);
      assert_art_valid((art_t *)&local_b8);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)((long)local_178.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_178.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  art_init_iterator(&local_148,&local_b8,true);
  _Var1 = art_iterator_lower_bound(&local_148,(art_key_chunk_t *)"000002");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x175);
  assert_key_eq(local_148.key,
                (art_key_chunk_t *)
                local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start[1]);
  _Var1 = art_iterator_lower_bound(&local_148,(art_key_chunk_t *)"000001");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x17b);
  assert_key_eq(local_148.key,
                (art_key_chunk_t *)
                *local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start);
  art_free(&local_b8);
  if (local_160.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  local_b8.first_free[1] = 0x10e4d7;
  local_b8.root = 0x10e4c9;
  local_b8.first_free[0] = 0x10e4d0;
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&local_b8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_178,__l_03,(allocator_type *)&local_148);
  local_b8.root = 1;
  local_b8.first_free[0] = 2;
  local_b8.first_free[1] = 3;
  __l_04._M_len = 3;
  __l_04._M_array = &local_b8.root;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_160,__l_04,(allocator_type *)&local_148);
  art_init_cleared(&local_b8);
  if (local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar2 = 0;
    do {
      art_insert(&local_b8,
                 (art_key_chunk_t *)
                 local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar2],
                 local_160.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar2]);
      assert_art_valid((art_t *)&local_b8);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)((long)local_178.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_178.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  art_init_iterator(&local_148,&local_b8,true);
  _Var1 = art_iterator_lower_bound(&local_148,(art_key_chunk_t *)"000201");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,400);
  assert_key_eq(local_148.key,
                (art_key_chunk_t *)
                local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start[2]);
  _Var1 = art_iterator_lower_bound(&local_148,(art_key_chunk_t *)"000099");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x197);
  assert_key_eq(local_148.key,
                (art_key_chunk_t *)
                *local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start);
  _Var1 = art_iterator_lower_bound(&local_148,(art_key_chunk_t *)"000300");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x19e);
  assert_key_eq(local_148.key,
                (art_key_chunk_t *)
                local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start[2]);
  _Var1 = art_iterator_next(&local_148);
  _assert_true((ulong)!_Var1,"art_iterator_next(&iterator)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x1a0);
  _Var1 = art_iterator_lower_bound(&local_148,(art_key_chunk_t *)"000300");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x1a2);
  assert_key_eq(local_148.key,
                (art_key_chunk_t *)
                local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start[2]);
  _Var1 = art_iterator_lower_bound(&local_148,(art_key_chunk_t *)"000100");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x1a9);
  assert_key_eq(local_148.key,
                (art_key_chunk_t *)
                *local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start);
  _Var1 = art_iterator_prev(&local_148);
  _assert_true((ulong)!_Var1,"art_iterator_prev(&iterator)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x1ab);
  _Var1 = art_iterator_lower_bound(&local_148,(art_key_chunk_t *)"000100");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x1ad);
  assert_key_eq(local_148.key,
                (art_key_chunk_t *)
                *local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start);
  art_free(&local_b8);
  if (local_160.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  art_init_cleared(&local_b8);
  art_insert(&local_b8,(art_key_chunk_t *)"000001",1);
  art_init_iterator(&local_148,&local_b8,true);
  _Var1 = art_iterator_lower_bound(&local_148,(art_key_chunk_t *)"000001");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x1be);
  assert_key_eq(local_148.key,(art_key_chunk_t *)"000001");
  _Var1 = art_iterator_lower_bound(&local_148,(art_key_chunk_t *)"000000");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x1c3);
  assert_key_eq(local_148.key,(art_key_chunk_t *)"000001");
  _Var1 = art_iterator_lower_bound(&local_148,(art_key_chunk_t *)"000002");
  _assert_true((ulong)!_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key3)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x1c8);
  art_free(&local_b8);
  return;
}

Assistant:

DEFINE_TEST(test_art_iterator_lower_bound) {
    {
        art_t art;
        art_init_cleared(&art);
        art_iterator_t iterator = art_init_iterator(&art, true);
        assert_null(iterator.value);
        assert_false(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)"000000"));
        assert_false(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)"000001"));
        art_free(&art);
    }
    {
        std::vector<const char*> keys = {
            "000001", "000002", "000003", "000004", "001005",
        };
        std::vector<art_val_t> values = {1, 2, 3, 4, 5};
        art_t art;
        art_init_cleared(&art);
        for (size_t i = 0; i < keys.size(); ++i) {
            art_insert(&art, (art_key_chunk_t*)keys[i], values[i]);
            assert_art_valid(&art);
        }

        art_iterator_t iterator = art_init_iterator(&art, true);
        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)keys[2]));
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[2]);
        const char* key = "000005";
        assert_true(art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[4]);
        art_free(&art);
    }
    {
        // Lower bound search within a node's children.
        std::vector<const char*> keys = {"000001", "000003", "000004",
                                         "001005"};
        std::vector<art_val_t> values = {1, 3, 4, 5};
        art_t art;
        art_init_cleared(&art);
        for (size_t i = 0; i < keys.size(); ++i) {
            art_insert(&art, (art_key_chunk_t*)keys[i], values[i]);
            assert_art_valid(&art);
        }
        art_iterator_t iterator = art_init_iterator(&art, true);

        const char* key1 = "000002";
        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key1));
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[1]);

        // Check that we can go backward within a node's children.
        const char* key2 = "000001";
        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key2));
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[0]);

        art_free(&art);
    }
    {
        // Lower bound search with leaf where prefix is equal but full key is
        // smaller.
        std::vector<const char*> keys = {"000100", "000200", "000300"};
        std::vector<art_val_t> values = {1, 2, 3};
        art_t art;
        art_init_cleared(&art);
        for (size_t i = 0; i < keys.size(); ++i) {
            art_insert(&art, (art_key_chunk_t*)keys[i], values[i]);
            assert_art_valid(&art);
        }
        art_iterator_t iterator = art_init_iterator(&art, true);

        {
            const char* key = "000201";
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[2]);
        }
        {
            // Check that we can go backward.
            const char* key = "000099";
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[0]);
        }
        {
            // Check that we can go backward from after the end.
            const char* key = "000300";
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[2]);
            assert_false(art_iterator_next(&iterator));
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[2]);
        }
        {
            // Check that we can go forward from before the start.
            const char* key = "000100";
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[0]);
            assert_false(art_iterator_prev(&iterator));
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[0]);
        }

        art_free(&art);
    }
    {
        // Lower bound search with only a single leaf.
        const char* key1 = "000001";
        art_val_t value{1};
        art_t art;
        art_init_cleared(&art);
        art_insert(&art, (art_key_chunk_t*)key1, value);

        art_iterator_t iterator = art_init_iterator(&art, true);

        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key1));
        assert_key_eq(iterator.key, (art_key_chunk_t*)key1);

        const char* key2 = "000000";
        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key2));
        assert_key_eq(iterator.key, (art_key_chunk_t*)key1);

        const char* key3 = "000002";
        assert_false(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key3));

        art_free(&art);
    }
}